

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cxx_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cxx::MessageGenerator::GenerateParseFromXmlString
          (MessageGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,"bool $classname$::ParseFromXmlString(const std::string& data) {\n",
                     "classname",&this->classname_);
  io::Printer::Indent(printer);
  io::Printer::Print(printer,
                     "::google::protobuf::xml::XmlMessage stub(*const_cast<$classname$*>(this));\n",
                     "classname",&this->classname_);
  io::Printer::Print(printer,
                     "if(!stub.ParseFromString(data)) {\n  GOOGLE_LOG(WARNING) << \"ParseFromXmlString failed: \" << stub.GetErrorText();\n  return false;\n}\n"
                    );
  io::Printer::Print(printer,
                     "if (!this->IsInitialized()) {\n  GOOGLE_LOG(WARNING)\n    << \"ParseFromXmlString failed: missing required fields: \"\n    << this->InitializationErrorString();\n  return false;\n}\n"
                    );
  io::Printer::Outdent(printer);
  io::Printer::Print(printer,"  return true;\n}\n");
  return;
}

Assistant:

void MessageGenerator::
GenerateParseFromXmlString(io::Printer* printer) {
  printer->Print(
    "bool $classname$::ParseFromXmlString(const std::string& data) {\n",
    "classname", classname_);
  printer->Indent();

  printer->Print(
    "::google::protobuf::xml::XmlMessage stub(*const_cast<$classname$*>(this));\n",
    "classname", classname_);
  printer->Print(
    "if(!stub.ParseFromString(data)) {\n"
    "  GOOGLE_LOG(WARNING) << \"ParseFromXmlString failed: \" << stub.GetErrorText();\n"
    "  return false;\n"
    "}\n");
  printer->Print(
    "if (!this->IsInitialized()) {\n"
    "  GOOGLE_LOG(WARNING)\n"
    "    << \"ParseFromXmlString failed: missing required fields: \"\n"
    "    << this->InitializationErrorString();\n"
    "  return false;\n"
    "}\n");

  printer->Outdent();
  printer->Print(
    "  return true;\n"
    "}\n");
}